

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::VerifyLinkItemIsTarget
          (cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  string_view sVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  cmake *this_00;
  string_view prefix;
  bool local_152;
  bool local_151;
  undefined1 local_148 [40];
  cmListFileBacktrace backtrace;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string e;
  string *str;
  cmLinkItem *item_local;
  LinkItemRole role_local;
  cmGeneratorTarget *this_local;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
    uVar3 = std::__cxx11::string::empty();
    local_151 = false;
    if ((uVar3 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
      local_152 = true;
      if (*pcVar5 != '-') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
        local_152 = true;
        if (*pcVar5 != '$') {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)psVar4);
          local_152 = true;
          if (*pcVar5 != '`') {
            lVar6 = std::__cxx11::string::find_first_of((char *)psVar4,0xc2880c);
            local_152 = true;
            if (lVar6 == -1) {
              sVar1 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
              prefix = (string_view)::cm::operator____s("<LINK_LIBRARY:",0xe);
              bVar2 = cmHasPrefix(sVar1,prefix);
              local_152 = true;
              if (!bVar2) {
                sVar1 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
                join_0x00000010_0x00000000_ = (string_view)::cm::operator____s("<LINK_GROUP:",0xc);
                local_152 = cmHasPrefix(sVar1,join_0x00000010_0x00000000_);
              }
            }
          }
        }
      }
      local_151 = local_152;
    }
    if (local_151 == false) {
      cmAlphaNum::cmAlphaNum(&local_e0,"Target \"");
      psVar4 = GetName_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_110,psVar4);
      pcVar5 = "its link interface contains";
      if (role == Implementation) {
        pcVar5 = "it links to";
      }
      backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar5;
      psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
      cmStrCat<char[48],char_const*,char[5],std::__cxx11::string,char[26],std::basic_string_view<char,std::char_traits<char>>>
                ((string *)local_b0,&local_e0,&local_110,
                 (char (*) [48])"\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",
                 (char **)&backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,(char (*) [5])0xc4d3c3,psVar4,
                 (char (*) [26])"\nwhich is not a target.  ",
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 (anonymous_namespace)::missingTargetPossibleReasons);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)(local_148 + 0x20),&item->Backtrace);
      bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_148 + 0x20))
      ;
      if (bVar2) {
        GetBacktrace((cmGeneratorTarget *)local_148);
        cmListFileBacktrace::operator=
                  ((cmListFileBacktrace *)(local_148 + 0x20),(cmListFileBacktrace *)local_148);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_148);
      }
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_b0,
                          (cmListFileBacktrace *)(local_148 + 0x20));
      this_local._7_1_ = false;
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_148 + 0x20));
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemIsTarget(LinkItemRole role,
                                               cmLinkItem const& item) const
{
  if (item.Target) {
    return true;
  }
  std::string const& str = item.AsStr();
  if (!str.empty() &&
      (str[0] == '-' || str[0] == '$' || str[0] == '`' ||
       str.find_first_of("/\\") != std::string::npos ||
       cmHasPrefix(str, "<LINK_LIBRARY:"_s) ||
       cmHasPrefix(str, "<LINK_GROUP:"_s))) {
    return true;
  }

  std::string e = cmStrCat("Target \"", this->GetName(),
                           "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",
                           role == LinkItemRole::Implementation
                             ? "it links to"
                             : "its link interface contains",
                           ":\n  ", item.AsStr(), "\nwhich is not a target.  ",
                           missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e, backtrace);
  return false;
}